

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_encoder.h
# Opt level: O0

_Bool rc_shift_low(lzma_range_encoder *rc,uint8_t *out,size_t *out_pos,size_t out_size)

{
  uint64_t uVar1;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  lzma_range_encoder *rc_local;
  
  if (((uint)rc->low < 0xff000000) || ((int)(rc->low >> 0x20) != 0)) {
    do {
      if (*out_pos == out_size) {
        return true;
      }
      out[*out_pos] = rc->cache + (char)(rc->low >> 0x20);
      *out_pos = *out_pos + 1;
      rc->cache = 0xff;
      uVar1 = rc->cache_size - 1;
      rc->cache_size = uVar1;
    } while (uVar1 != 0);
    rc->cache = (uint8_t)(rc->low >> 0x18);
  }
  rc->cache_size = rc->cache_size + 1;
  rc->low = (rc->low & 0xffffff) << 8;
  return false;
}

Assistant:

static inline bool
rc_shift_low(lzma_range_encoder *rc,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	if ((uint32_t)(rc->low) < (uint32_t)(0xFF000000)
			|| (uint32_t)(rc->low >> 32) != 0) {
		do {
			if (*out_pos == out_size)
				return true;

			out[*out_pos] = rc->cache + (uint8_t)(rc->low >> 32);
			++*out_pos;
			rc->cache = 0xFF;

		} while (--rc->cache_size != 0);

		rc->cache = (rc->low >> 24) & 0xFF;
	}

	++rc->cache_size;
	rc->low = (rc->low & 0x00FFFFFF) << RC_SHIFT_BITS;

	return false;
}